

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::Float::stTruncated(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  double local_38;
  double integerPart;
  double fractPart;
  double fv;
  Oop v;
  InterpreterProxy *interpreter_local;
  
  v.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)interpreter;
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    fv = (double)(**(code **)(*(long *)v.field_0 + 0x58))();
    bVar1 = Oop::isFloatOrInt((Oop *)&fv);
    if (bVar1) {
      fractPart = Oop::decodeFloatOrInt((Oop *)&fv);
      integerPart = modf(fractPart,&local_38);
      interpreter_local._4_4_ = (**(code **)(*(long *)v.field_0 + 0xb0))(v.field_0,(long)local_38);
    }
    else {
      interpreter_local._4_4_ = (**(code **)(*(long *)v.field_0 + 0xf0))();
    }
  }
  else {
    interpreter_local._4_4_ = (**(code **)(*(long *)v.field_0 + 0xf0))();
  }
  return interpreter_local._4_4_;
}

Assistant:

int Float::stTruncated(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto v = interpreter->getReceiver();
    if (!v.isFloatOrInt())
        return interpreter->primitiveFailed();

    auto fv = v.decodeFloatOrInt();
    double fractPart, integerPart;
    fractPart = modf(fv, &integerPart);
    return interpreter->returnInteger((SmallIntegerValue)integerPart);
}